

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

common_chat_params *
common_chat_params_init_deepseek_r1(common_chat_template *tmpl,templates_params *inputs)

{
  bool bVar1;
  byte bVar2;
  string *psVar3;
  long lVar4;
  common_chat_format cVar5;
  long in_RDX;
  chat_template *in_RSI;
  common_chat_params *in_RDI;
  common_grammar_options *in_stack_00000040;
  function<void_(const_common_grammar_builder_&)> *in_stack_00000048;
  string prompt;
  common_chat_params *data;
  nullptr_t in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  anon_class_16_2_8f10333a *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  string *suffix;
  chat_template *str;
  allocator<char> *in_stack_fffffffffffffeb0;
  flag_type __f;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  common_chat_params *__fmt;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffee0;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  string local_c8;
  string local_a8 [55];
  undefined1 local_71;
  allocator<char> local_60 [8];
  ordered_json *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb7;
  ordered_json *in_stack_ffffffffffffffb8;
  ordered_json *in_stack_ffffffffffffffc0;
  common_chat_template *in_stack_ffffffffffffffc8;
  
  __fmt = in_RDI;
  common_chat_params::common_chat_params
            ((common_chat_params *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::is_array((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)(in_RDX + 0x10));
  if ((bVar1) &&
     (bVar1 = nlohmann::json_abi_v3_11_3::
              basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::empty((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffe88), !bVar1)) {
    in_stack_fffffffffffffebf = false;
    if (*(int *)(in_RDX + 0x20) != 1) {
      in_stack_fffffffffffffebf =
           nlohmann::json_abi_v3_11_3::
           basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::is_null((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)(in_RDX + 0x28));
    }
    in_RDI->grammar_lazy = (bool)in_stack_fffffffffffffebf;
    in_stack_fffffffffffffeb0 = local_60;
    std::function<void(common_grammar_builder_const&)>::
    function<common_chat_params_init_deepseek_r1(minja::chat_template_const&,templates_params_const&)::__0,void>
              ((function<void_(const_common_grammar_builder_&)> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    local_71 = 0;
    build_grammar_abi_cxx11_(in_stack_00000048,in_stack_00000040);
    std::__cxx11::string::operator=((string *)&in_RDI->grammar,(string *)&stack0xffffffffffffffc0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    std::function<void_(const_common_grammar_builder_&)>::~function
              ((function<void_(const_common_grammar_builder_&)> *)0x24a87a);
  }
  str = in_RSI;
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::empty((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffe88);
  if (bVar1) {
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78);
  }
  else {
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(in_stack_fffffffffffffee0,
                 (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffed8);
  }
  suffix = &local_c8;
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
  apply(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
        (bool)in_stack_ffffffffffffffb7,in_stack_ffffffffffffffa8);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  psVar3 = minja::chat_template::source_abi_cxx11_(in_RSI);
  lVar4 = std::__cxx11::string::find((char *)psVar3,0x380cac);
  if (lVar4 != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb0);
    __f = (flag_type)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    bVar2 = string_ends_with((string *)str,suffix);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    if (((bVar2 & 1) != 0) &&
       (std::__cxx11::string::operator+=(local_a8,anon_var_dwarf_15ebd9),
       (*(byte *)(in_RDX + 0x60) & 1) != 0)) {
      std::__cxx11::string::operator+=(local_a8,anon_var_dwarf_15ebe5);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_RDI,
               (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),__f);
    std::
    regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,(char *)__fmt,
               (match_flag_type)((ulong)in_RDI >> 0x20));
    std::__cxx11::string::operator=(local_a8,local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               CONCAT17(bVar2,in_stack_fffffffffffffe80));
  }
  std::__cxx11::string::operator=((string *)&in_RDI->prompt,local_a8);
  cVar5 = COMMON_CHAT_FORMAT_DEEPSEEK_R1;
  if ((*(byte *)(in_RDX + 0x61) & 1) != 0) {
    cVar5 = COMMON_CHAT_FORMAT_DEEPSEEK_R1_EXTRACT_REASONING;
  }
  in_RDI->format = cVar5;
  std::__cxx11::string::~string(local_a8);
  return __fmt;
}

Assistant:

static common_chat_params common_chat_params_init_deepseek_r1(const common_chat_template & tmpl, const struct templates_params & inputs) {
    common_chat_params data;
    if (inputs.tools.is_array() && !inputs.tools.empty()) {
        data.grammar_lazy = inputs.tool_choice != COMMON_CHAT_TOOL_CHOICE_REQUIRED && inputs.json_schema.is_null();
        data.grammar = build_grammar([&](const common_grammar_builder & builder) {
            std::vector<std::string> tool_rules;
            foreach_function(inputs.tools, [&](const json & tool) {
                const auto & function = tool.at("function");
                std::string name = function.at("name");
                auto parameters = function.at("parameters");
                builder.resolve_refs(parameters);
                tool_rules.push_back(builder.add_rule(name + "-call",
                    "\"<｜tool▁call▁begin｜>function<｜tool▁sep｜>" + name + "\\n"
                    "```json\\n\" " + builder.add_schema(name + "-args", parameters) + " "
                    "\"```<｜tool▁call▁end｜>\""));
            });
            // Distill Qwen 7B & 32B models seem confused re/ syntax of their tool call opening tag,
            // so we accept common variants (then it's all constrained)
            builder.add_rule("root",
                "( \"<｜tool▁calls▁begin｜>\" | \"<｜tool_calls_begin｜>\" | \"<｜tool calls begin｜>\" | \"<｜tool\\\\_calls\\\\_begin｜>\" ) "
                "(" + string_join(tool_rules, " | ") + ")" + (inputs.parallel_tool_calls ? "*" : "") + " "
                "\"<｜tool▁calls▁end｜>\""
                " space");
            data.grammar_triggers.push_back({COMMON_GRAMMAR_TRIGGER_TYPE_WORD, "<｜tool▁calls▁begin｜>"});
            data.grammar_triggers.push_back({COMMON_GRAMMAR_TRIGGER_TYPE_WORD, "<｜tool_calls_begin｜>"});
            data.grammar_triggers.push_back({COMMON_GRAMMAR_TRIGGER_TYPE_WORD, "<｜tool calls begin｜>"});
            data.grammar_triggers.push_back({COMMON_GRAMMAR_TRIGGER_TYPE_WORD, "<｜tool\\_calls\\_begin｜>"});
            data.preserved_tokens = {
                "<think>",
                "</think>",
                "<｜tool▁calls▁begin｜>",
                "<｜tool▁call▁begin｜>",
                "<｜tool▁sep｜>",
                "<｜tool▁call▁end｜>",
                "<｜tool▁calls▁end｜",
            };
        });
    }
    auto prompt = apply(tmpl, inputs.messages, inputs.tools.empty() ? json() : inputs.tools, inputs.add_generation_prompt);

    // Hacks to fix the official (broken) prompt.
    // It is advisable to use --chat-template-file models/templates/llama-cpp-deepseek-r1.jinja instead,
    // until the official template is fixed.
    if (tmpl.source().find("{% if ns.is_tool %}{{'<｜tool▁outputs▁end｜>'}}") != std::string::npos) {
        // Don't leave the chat dangling after tool results
        if (string_ends_with(prompt, "<｜tool▁outputs▁end｜>")) {
            prompt += "<｜end▁of▁sentence｜>";
            if (inputs.add_generation_prompt) {
                prompt += "<｜Assistant｜>";
            }
        }
        // Fix up tool call delta example added by Minja
        prompt = std::regex_replace(
            prompt,
            std::regex("(<｜tool▁call▁end｜>)[\\s\\r\\n]*(<｜tool▁outputs▁begin｜>|<｜User｜>)"),
            "$1<｜tool▁calls▁end｜><｜end▁of▁sentence｜>$2");
    }
    data.prompt = prompt;
    data.format = inputs.extract_reasoning ? COMMON_CHAT_FORMAT_DEEPSEEK_R1_EXTRACT_REASONING : COMMON_CHAT_FORMAT_DEEPSEEK_R1;
    return data;
}